

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O2

void __thiscall icu_63::anon_unknown_4::SortKeyLevel::appendWeight16(SortKeyLevel *this,uint32_t w)

{
  UBool UVar1;
  int iVar2;
  uchar uVar3;
  int appendCapacity;
  
  uVar3 = (uchar)w;
  appendCapacity = 2 - (uint)(uVar3 == '\0');
  iVar2 = this->len;
  if ((this->buffer).capacity < iVar2 + appendCapacity) {
    UVar1 = ensureCapacity(this,appendCapacity);
    if (UVar1 == '\0') {
      return;
    }
    iVar2 = this->len;
  }
  this->len = iVar2 + 1;
  (this->buffer).ptr[iVar2] = (uchar)(w >> 8);
  if (uVar3 != '\0') {
    iVar2 = this->len;
    this->len = iVar2 + 1;
    (this->buffer).ptr[iVar2] = uVar3;
  }
  return;
}

Assistant:

void
SortKeyLevel::appendWeight16(uint32_t w) {
    U_ASSERT((w & 0xffff) != 0);
    uint8_t b0 = (uint8_t)(w >> 8);
    uint8_t b1 = (uint8_t)w;
    int32_t appendLength = (b1 == 0) ? 1 : 2;
    if((len + appendLength) <= buffer.getCapacity() || ensureCapacity(appendLength)) {
        buffer[len++] = b0;
        if(b1 != 0) {
            buffer[len++] = b1;
        }
    }
}